

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterNext_None(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  Fts5Hash *pHash;
  Fts5Data *pFVar1;
  i64 p_00;
  char *pData;
  byte bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  i64 iDelta;
  int nList;
  int *local_40;
  char *zTerm;
  
  iVar6 = pIter->iLeafOffset;
  if ((pIter->pSeg != (Fts5StructureSegment *)0x0) && (pIter->pLeaf->szLeaf <= iVar6)) {
    fts5SegIterNextPage(p,pIter);
    if (p->rc != 0) {
      return;
    }
    if (pIter->pLeaf == (Fts5Data *)0x0) {
      return;
    }
    pIter->iRowid = 0;
    iVar6 = 4;
  }
  if (iVar6 < pIter->iEndofDoclist) {
    bVar2 = sqlite3Fts5GetVarint(pIter->pLeaf->p + iVar6,(u64 *)&iDelta);
    pIter->iLeafOffset = (uint)bVar2 + iVar6;
    pIter->iRowid = pIter->iRowid + iDelta;
  }
  else {
    if ((pIter->flags & 1) != 0) {
LAB_001b7d0a:
      sqlite3_free(pIter->pLeaf);
      pIter->pLeaf = (Fts5Data *)0x0;
      return;
    }
    if (pIter->pSeg == (Fts5StructureSegment *)0x0) {
      iDelta = 0;
      zTerm = (char *)0x0;
      pHash = p->pHash;
      pHash->pScan = pHash->pScan->pScanNext;
      sqlite3Fts5HashScanEntry(pHash,&zTerm,(u8 **)&iDelta,&nList);
      pData = zTerm;
      p_00 = iDelta;
      if (iDelta == 0) goto LAB_001b7d0a;
      pFVar1 = pIter->pLeaf;
      pFVar1->p = (u8 *)iDelta;
      pFVar1->nn = nList;
      pFVar1->szLeaf = nList;
      pIter->iEndofDoclist = nList;
      local_40 = &p->rc;
      sVar5 = strlen(zTerm);
      sqlite3Fts5BufferSet(local_40,&pIter->term,(int)sVar5,(u8 *)pData);
      bVar2 = sqlite3Fts5GetVarint((uchar *)p_00,(u64 *)&pIter->iRowid);
      pIter->iLeafOffset = (uint)bVar2;
    }
    else {
      iDelta = iDelta & 0xffffffff00000000;
      iVar3 = fts5LeafFirstTermOff(pIter->pLeaf);
      iVar4 = 0;
      if (iVar6 != iVar3) {
        iVar4 = sqlite3Fts5GetVarint32(pIter->pLeaf->p + iVar6,(u32 *)&iDelta);
        iVar6 = iVar6 + iVar4;
        iVar4 = (int)iDelta;
      }
      pIter->iLeafOffset = iVar6;
      fts5SegIterLoadTerm(p,pIter,iVar4);
    }
    if (pbNewTerm != (int *)0x0) {
      *pbNewTerm = 1;
    }
  }
  fts5SegIterLoadNPos(p,pIter);
  return;
}

Assistant:

static void fts5SegIterNext_None(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  int iOff;

  assert( p->rc==SQLITE_OK );
  assert( (pIter->flags & FTS5_SEGITER_REVERSE)==0 );
  assert( p->pConfig->eDetail==FTS5_DETAIL_NONE );

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  iOff = pIter->iLeafOffset;

  /* Next entry is on the next page */
  if( pIter->pSeg && iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( p->rc || pIter->pLeaf==0 ) return;
    pIter->iRowid = 0;
    iOff = 4;
  }

  if( iOff<pIter->iEndofDoclist ){
    /* Next entry is on the current page */
    i64 iDelta;
    iOff += sqlite3Fts5GetVarint(&pIter->pLeaf->p[iOff], (u64*)&iDelta);
    pIter->iLeafOffset = iOff;
    pIter->iRowid += iDelta;
  }else if( (pIter->flags & FTS5_SEGITER_ONETERM)==0 ){
    if( pIter->pSeg ){
      int nKeep = 0;
      if( iOff!=fts5LeafFirstTermOff(pIter->pLeaf) ){
        iOff += fts5GetVarint32(&pIter->pLeaf->p[iOff], nKeep);
      }
      pIter->iLeafOffset = iOff;
      fts5SegIterLoadTerm(p, pIter, nKeep);
    }else{
      const u8 *pList = 0;
      const char *zTerm = 0;
      int nList;
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &pList, &nList);
      if( pList==0 ) goto next_none_eof;
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList;
      sqlite3Fts5BufferSet(&p->rc,&pIter->term, (int)strlen(zTerm), (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
    }

    if( pbNewTerm ) *pbNewTerm = 1;
  }else{
    goto next_none_eof;
  }

  fts5SegIterLoadNPos(p, pIter);

  return;
 next_none_eof:
  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
}